

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

ArenaAllocator * __thiscall JsrtDebugManager::GetDebugObjectArena(JsrtDebugManager *this)

{
  HeapAllocator *alloc;
  ArenaAllocator *this_00;
  PageAllocator *pageAllocator;
  Recycler *this_01;
  ArenaData *local_98;
  TrackAllocData local_38;
  JsrtDebugManager *local_10;
  JsrtDebugManager *this_local;
  
  if (this->debugObjectArena == (ArenaAllocator *)0x0) {
    local_10 = this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&Memory::ArenaAllocator::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
               ,0x2b2);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
    this_00 = (ArenaAllocator *)new<Memory::HeapAllocator>(0x80,alloc,0x350bd0);
    pageAllocator = ThreadContext::GetPageAllocator(this->threadContext);
    Memory::ArenaAllocator::ArenaAllocator
              (this_00,L"DebugObjectArena",pageAllocator,Js::Throw::OutOfMemory,
               JsUtil::ExternalApi::RecoverUnusedMemory);
    this->debugObjectArena = this_00;
    this_01 = ThreadContext::GetRecycler(this->threadContext);
    local_98 = (ArenaData *)0x0;
    if (this->debugObjectArena != (ArenaAllocator *)0x0) {
      local_98 = &(this->debugObjectArena->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                  super_ArenaData;
    }
    Memory::Recycler::RegisterExternalGuestArena(this_01,local_98);
  }
  return this->debugObjectArena;
}

Assistant:

ArenaAllocator* JsrtDebugManager::GetDebugObjectArena()
{
    if (this->debugObjectArena == nullptr)
    {
        this->debugObjectArena = HeapNew(ArenaAllocator, _u("DebugObjectArena"), this->threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);

        this->threadContext->GetRecycler()->RegisterExternalGuestArena(this->debugObjectArena);
    }

    return this->debugObjectArena;
}